

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void GA_Median_patch64(int g_a,int64_t *alo,int64_t *ahi,int g_b,int64_t *blo,int64_t *bhi,int g_c,
                      int64_t *clo,int64_t *chi,int g_m,int64_t *mlo,int64_t *mhi)

{
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  long in_R9;
  int in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  int in_stack_00000020;
  long in_stack_00000028;
  int i_7;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Integer _ga_mhi [7];
  Integer _ga_mlo [7];
  Integer _ga_chi [7];
  Integer _ga_clo [7];
  Integer _ga_bhi [7];
  Integer _ga_blo [7];
  Integer _ga_ahi [7];
  Integer _ga_alo [7];
  Integer mndim;
  Integer cndim;
  Integer bndim;
  Integer andim;
  Integer m;
  Integer c;
  Integer b;
  Integer a;
  Integer *in_stack_00000e90;
  Integer *in_stack_00000e98;
  Integer in_stack_00000ea0;
  Integer *in_stack_00000ea8;
  Integer *in_stack_00000eb0;
  Integer in_stack_00000eb8;
  Integer in_stack_00000ed0;
  Integer *in_stack_00000ed8;
  Integer *in_stack_00000ee0;
  Integer in_stack_00000ee8;
  Integer *in_stack_00000ef0;
  Integer *in_stack_00000ef8;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  long local_288 [8];
  long local_248 [8];
  long local_208 [8];
  long local_1c8 [8];
  long local_188 [8];
  long local_148 [8];
  long local_108 [5];
  Integer in_stack_ffffffffffffff20;
  long local_c8 [8];
  Integer local_88;
  Integer local_80;
  Integer local_78;
  Integer local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_30;
  long local_28;
  
  local_50 = (long)in_EDI;
  local_58 = (long)in_ECX;
  local_60 = (long)in_stack_00000008;
  local_68 = (long)in_stack_00000020;
  local_48 = in_R9;
  local_40 = in_R8;
  local_30 = in_RDX;
  local_28 = in_RSI;
  local_70 = pnga_ndim(in_stack_ffffffffffffff20);
  local_78 = pnga_ndim(in_stack_ffffffffffffff20);
  local_80 = pnga_ndim(in_stack_ffffffffffffff20);
  local_88 = pnga_ndim(in_stack_ffffffffffffff20);
  for (local_28c = 0; local_28c < local_70; local_28c = local_28c + 1) {
    local_c8[(local_70 - local_28c) + -1] = *(long *)(local_28 + (long)local_28c * 8) + 1;
  }
  for (local_290 = 0; local_290 < local_70; local_290 = local_290 + 1) {
    local_108[(local_70 - local_290) + -1] = *(long *)(local_30 + (long)local_290 * 8) + 1;
  }
  for (local_294 = 0; local_294 < local_78; local_294 = local_294 + 1) {
    local_148[(local_78 - local_294) + -1] = *(long *)(local_40 + (long)local_294 * 8) + 1;
  }
  for (local_298 = 0; local_298 < local_78; local_298 = local_298 + 1) {
    local_188[(local_78 - local_298) + -1] = *(long *)(local_48 + (long)local_298 * 8) + 1;
  }
  for (local_29c = 0; local_29c < local_80; local_29c = local_29c + 1) {
    local_1c8[(local_80 - local_29c) + -1] = *(long *)(in_stack_00000010 + (long)local_29c * 8) + 1;
  }
  for (local_2a0 = 0; local_2a0 < local_80; local_2a0 = local_2a0 + 1) {
    local_208[(local_80 - local_2a0) + -1] = *(long *)(in_stack_00000018 + (long)local_2a0 * 8) + 1;
  }
  for (local_2a4 = 0; local_2a4 < local_88; local_2a4 = local_2a4 + 1) {
    local_248[(local_88 - local_2a4) + -1] = *(long *)(in_stack_00000028 + (long)local_2a4 * 8) + 1;
  }
  for (local_2a8 = 0; local_2a8 < local_88; local_2a8 = local_2a8 + 1) {
    local_288[(local_88 - local_2a8) + -1] = *(long *)(_i_7 + (long)local_2a8 * 8) + 1;
  }
  pnga_median_patch(in_stack_00000eb8,in_stack_00000eb0,in_stack_00000ea8,in_stack_00000ea0,
                    in_stack_00000e98,in_stack_00000e90,in_stack_00000ed0,in_stack_00000ed8,
                    in_stack_00000ee0,in_stack_00000ee8,in_stack_00000ef0,in_stack_00000ef8);
  return;
}

Assistant:

void GA_Median_patch64(int g_a, int64_t *alo, int64_t *ahi,
                       int g_b, int64_t *blo, int64_t *bhi,
                       int g_c, int64_t *clo, int64_t *chi,
                       int g_m, int64_t *mlo, int64_t *mhi){

   Integer a = (Integer)g_a;
    Integer b = (Integer)g_b;
    Integer c = (Integer)g_c;
    Integer m = (Integer )g_m;
    Integer andim = wnga_ndim(a);
    Integer bndim = wnga_ndim(b);
    Integer cndim = wnga_ndim(c);
    Integer mndim = wnga_ndim(m);
    Integer _ga_alo[MAXDIM], _ga_ahi[MAXDIM];
    Integer _ga_blo[MAXDIM], _ga_bhi[MAXDIM];
    Integer _ga_clo[MAXDIM], _ga_chi[MAXDIM];
    Integer _ga_mlo[MAXDIM], _ga_mhi[MAXDIM];
    COPYINDEX_C2F(alo,_ga_alo, andim);
    COPYINDEX_C2F(ahi,_ga_ahi, andim);
    COPYINDEX_C2F(blo,_ga_blo, bndim);
    COPYINDEX_C2F(bhi,_ga_bhi, bndim);
    COPYINDEX_C2F(clo,_ga_clo, cndim);
    COPYINDEX_C2F(chi,_ga_chi, cndim);
    COPYINDEX_C2F(mlo,_ga_mlo, mndim);
    COPYINDEX_C2F(mhi,_ga_mhi, mndim);
    wnga_median_patch(a, _ga_alo, _ga_ahi, b, _ga_blo, _ga_bhi, c, _ga_clo, _ga_chi, m, _ga_mlo, _ga_mhi);
}